

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void test_ecdsa_sign(void)

{
  undefined8 uVar1;
  int iVar2;
  EC_KEY *key;
  EVP_PKEY *pkey_00;
  size_t sVar3;
  EVP_MD *md;
  ptls_iovec_t pVar4;
  ptls_iovec_t signature;
  undefined1 local_448 [8];
  uint8_t sigbuf_small [1024];
  undefined1 local_40 [8];
  ptls_buffer_t sigbuf;
  char *message;
  EC_KEY *eckey;
  EVP_PKEY *pkey;
  
  key = EC_KEY_new_by_curve_name(0x19f);
  EC_KEY_generate_key(key);
  pkey_00 = EVP_PKEY_new();
  EVP_PKEY_set1_EC_KEY(pkey_00,key);
  EC_KEY_free(key);
  sigbuf._24_8_ = anon_var_dwarf_b951;
  ptls_buffer_init((ptls_buffer_t *)local_40,local_448,0x400);
  uVar1 = sigbuf._24_8_;
  sVar3 = strlen((char *)sigbuf._24_8_);
  pVar4 = ptls_iovec_init((void *)uVar1,sVar3);
  md = EVP_sha256();
  iVar2 = do_sign((EVP_PKEY *)pkey_00,(ptls_buffer_t *)local_40,pVar4,(EVP_MD *)md);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c",0xa5);
  EVP_PKEY_up_ref(pkey_00);
  uVar1 = sigbuf._24_8_;
  sVar3 = strlen((char *)sigbuf._24_8_);
  pVar4 = ptls_iovec_init((void *)uVar1,sVar3);
  signature = ptls_iovec_init((void *)local_40,sigbuf.capacity);
  iVar2 = verify_sign(pkey_00,pVar4,signature);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c",0xa7);
  ptls_buffer_dispose((ptls_buffer_t *)local_40);
  EVP_PKEY_free(pkey_00);
  return;
}

Assistant:

static void test_ecdsa_sign(void)
{
    EVP_PKEY *pkey;

    { /* create pkey */
        EC_KEY *eckey = EC_KEY_new_by_curve_name(NID_X9_62_prime256v1);
        EC_KEY_generate_key(eckey);
        pkey = EVP_PKEY_new();
        EVP_PKEY_set1_EC_KEY(pkey, eckey);
        EC_KEY_free(eckey);
    }

    const char *message = "hello world";
    ptls_buffer_t sigbuf;
    uint8_t sigbuf_small[1024];

    ptls_buffer_init(&sigbuf, sigbuf_small, sizeof(sigbuf_small));
    ok(do_sign(pkey, &sigbuf, ptls_iovec_init(message, strlen(message)), EVP_sha256()) == 0);
    EVP_PKEY_up_ref(pkey);
    ok(verify_sign(pkey, ptls_iovec_init(message, strlen(message)), ptls_iovec_init(sigbuf.base, sigbuf.off)) == 0);

    ptls_buffer_dispose(&sigbuf);
    EVP_PKEY_free(pkey);
}